

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O3

void __thiscall
PathTracerViewer::create_gen_graphics_pipeline
          (PathTracerViewer *this,shared_ptr<myvk::Device> *device)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *pvVar3;
  ShaderModule *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPushConstantRange> __l_00;
  initializer_list<VkPipelineShaderStageCreateInfo> __l_01;
  initializer_list<VkDynamicState> __l_02;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  uint32_t kPathTracerViewerGenFragSpirv [460];
  allocator_type local_a3a;
  allocator_type local_a39;
  undefined1 local_a38 [32];
  undefined1 local_a18 [36];
  undefined4 local_9f4;
  undefined1 local_9f0 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_9e0;
  element_type *local_9d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9d0;
  VkSpecializationInfo *local_9c8;
  undefined1 auStack_9c0 [16];
  VertexInputState local_9b0;
  InputAssemblyState local_948;
  VkStructureType local_920;
  void *local_918;
  undefined8 uStack_910;
  bool local_908;
  ViewportState local_900;
  MultisampleState local_898;
  VkStructureType local_860;
  void *local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined1 local_838 [32];
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  bool local_7f8;
  ColorBlendState local_7f0;
  DynamicState local_798;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  local_758 [76];
  
  peVar1 = (this->m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_a38._0_8_ =
       (peVar1->m_target_descriptor_set_layout).
       super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a38._8_8_ =
       (peVar1->m_target_descriptor_set_layout).
       super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)local_a38;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector(local_758,__l,&local_a3a);
  local_a18._28_8_ = 0x10;
  local_9f4 = 4;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)(local_a18 + 0x1c);
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_9f0,__l_00,
             &local_a39);
  myvk::PipelineLayout::Create
            ((PipelineLayout *)local_a18,device,local_758,
             (vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_9f0);
  uVar7 = local_a18._8_8_;
  uVar6 = local_a18._0_8_;
  local_a18._0_8_ = (pointer)0x0;
  local_a18._8_8_ = (pointer)0x0;
  p_Var2 = (this->m_gen_pipeline_layout).
           super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_gen_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar6;
  (this->m_gen_pipeline_layout).super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((pointer)local_a18._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a18._8_8_);
    }
  }
  pvVar3 = (void *)CONCAT44(local_9f0._4_4_,local_9f0._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)_Stack_9e0._M_pi - (long)pvVar3);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector(local_758);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_);
  }
  memcpy(local_758,&DAT_00273da0,0x730);
  myvk::ShaderModule::Create((ShaderModule *)local_9f0,device,kQuadVertSpv,0x354);
  uVar6 = local_9f0._8_8_;
  this_00 = (ShaderModule *)CONCAT44(local_9f0._4_4_,local_9f0._0_4_);
  myvk::ShaderModule::Create((ShaderModule *)local_9f0,device,(uint32_t *)local_758,0x730);
  uVar7 = local_9f0._8_8_;
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_9f0,this_00,VK_SHADER_STAGE_VERTEX_BIT,
             (VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_9c0,
             (ShaderModule *)CONCAT44(local_9f0._4_4_,local_9f0._0_4_),VK_SHADER_STAGE_FRAGMENT_BIT,
             (VkSpecializationInfo *)0x0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_9f0;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)local_a18,__l_01,(allocator_type *)local_a38);
  local_9f0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_9f0._8_8_ = (element_type *)0x0;
  _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9d8 = (element_type *)0x0;
  _Stack_9d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9c8 = (VkSpecializationInfo *)0x0;
  auStack_9c0._0_8_ = 0;
  auStack_9c0._8_4_ = 0.0;
  local_9b0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9b0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9b0.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9b0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9b0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9b0.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9b0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_9b0.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_9b0.m_enable = false;
  local_9b0.m_create_info.pNext = (void *)0x0;
  local_9b0.m_create_info.flags = 0;
  local_9b0.m_create_info.vertexBindingDescriptionCount = 0;
  local_9b0.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_9b0.m_create_info._28_8_ = 0;
  local_948.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_948.m_enable = false;
  local_948.m_create_info.pNext = (void *)0x0;
  local_948.m_create_info.flags = 0;
  local_948.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_948.m_create_info.primitiveRestartEnable = 0;
  local_920 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_908 = false;
  local_918 = (void *)0x0;
  uStack_910._0_4_ = 0;
  uStack_910._4_4_ = 0;
  local_900.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_900.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_900.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_900.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_900.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_900.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_900.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_900.m_create_info.pScissors = (VkRect2D *)0x0;
  local_900.m_enable = false;
  local_900.m_create_info.pNext = (void *)0x0;
  local_900.m_create_info.flags = 0;
  local_900.m_create_info.viewportCount = 0;
  local_900.m_create_info.pViewports._0_4_ = 0;
  local_900.m_create_info._28_8_ = 0;
  local_898.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_898.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_898._41_8_ = 0;
  local_898.m_create_info.sampleShadingEnable = 0;
  local_898.m_create_info.minSampleShading = 0.0;
  local_898.m_create_info.pSampleMask._0_1_ = 0;
  local_898.m_create_info.pSampleMask._1_7_ = 0;
  local_898.m_create_info.pNext = (void *)0x0;
  local_898.m_create_info.flags = 0;
  local_898.m_create_info.rasterizationSamples = 0;
  local_860 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_858 = (void *)0x0;
  uStack_850._0_4_ = 0;
  uStack_850._4_4_ = 0;
  local_848._0_4_ = 0;
  local_848._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_840._0_4_ = 0;
  uStack_840._4_4_ = 0;
  local_838._0_4_ = VK_STENCIL_OP_KEEP;
  local_838._4_4_ = VK_STENCIL_OP_KEEP;
  local_838._8_4_ = VK_STENCIL_OP_KEEP;
  local_838._12_4_ = VK_COMPARE_OP_NEVER;
  local_838._16_4_ = 0;
  local_838._20_4_ = 0;
  local_838._24_4_ = 0;
  local_838._28_4_ = VK_STENCIL_OP_KEEP;
  local_818._0_4_ = VK_STENCIL_OP_KEEP;
  local_818._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_810._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_810._4_4_ = 0;
  local_808._0_4_ = 0;
  local_808._4_4_ = 0;
  uStack_800._0_4_ = 0.0;
  uStack_800._4_4_ = 0.0;
  local_7f8 = false;
  local_7f0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7f0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7f0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7f0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_7f0.m_enable = false;
  local_7f0.m_create_info.blendConstants[0] = 0.0;
  local_7f0.m_create_info.blendConstants[1] = 0.0;
  local_7f0.m_create_info.blendConstants[2] = 0.0;
  local_7f0.m_create_info.blendConstants[3] = 0.0;
  local_7f0.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_7f0.m_create_info.attachmentCount = 0;
  local_7f0.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_7f0.m_create_info.pNext = (void *)0x0;
  local_7f0.m_create_info.flags = 0;
  local_7f0.m_create_info.logicOpEnable = 0;
  local_798.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_798.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_798.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_798.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_798.m_create_info.pDynamicStates._0_1_ = 0;
  local_798._49_8_ = 0;
  local_798.m_create_info.pNext = (void *)0x0;
  local_798.m_create_info.flags._0_1_ = 0;
  local_798.m_create_info._17_7_ = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(&local_9b0);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_948,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_900,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_9f0,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1)
  ;
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_898,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_7f0,1,0);
  local_a18._28_8_ = 0x100000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)(local_a18 + 0x1c);
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_a38,__l_02,
             (allocator_type *)&local_a3a);
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_798,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_a38);
  if ((element_type *)local_a38._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_a38._0_8_,local_a38._16_8_ - local_a38._0_8_);
  }
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_a38,&this->m_gen_pipeline_layout,&this->m_gen_render_pass,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)local_a18,(GraphicsPipelineState *)local_9f0,0);
  uVar5 = local_a38._8_8_;
  uVar4 = local_a38._0_8_;
  local_a38._0_8_ = (element_type *)0x0;
  local_a38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->m_gen_graphics_pipeline).
           super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_gen_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->m_gen_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_);
    }
  }
  if (local_798.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_798.m_dynamic_states.
                    super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_798.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_798.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_7f0.m_color_blend_attachments.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7f0.m_color_blend_attachments.
                    super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_7f0.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_7f0.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_900.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_900.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_900.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_900.m_viewports.
                    super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((VkSpecializationInfo *)
      local_9b0.m_attributes.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkSpecializationInfo *)0x0) {
    operator_delete(local_9b0.m_attributes.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_9b0.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9b0.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_9b0.m_bindings.
      super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9b0.m_bindings.
                    super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_9b0.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9b0.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_a18._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a18._0_8_,local_a18._16_8_ - local_a18._0_8_);
  }
  if ((element_type *)uVar7 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
  }
  if ((element_type *)uVar6 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
  }
  return;
}

Assistant:

void PathTracerViewer::create_gen_graphics_pipeline(const std::shared_ptr<myvk::Device> &device) {
	m_gen_pipeline_layout = myvk::PipelineLayout::Create(device, {m_path_tracer_ptr->GetTargetDescriptorSetLayout()},
	                                                     {{VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t)}});
	constexpr uint32_t kPathTracerViewerGenFragSpirv[] = {
#include "spirv/path_tracer_viewer_gen.frag.u32"
	};

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerGenFragSpirv, sizeof(kPathTracerViewerGenFragSpirv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_gen_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_gen_pipeline_layout, m_gen_render_pass, shader_stages, pipeline_state, 0);
}